

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

unsigned_long __thiscall argagg::option_results::as<unsigned_long>(option_results *this)

{
  size_type sVar1;
  out_of_range *this_00;
  const_reference this_01;
  unsigned_long uVar2;
  option_results *this_local;
  
  sVar1 = std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::size
                    (&this->all);
  if (sVar1 == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"no option arguments to convert");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  this_01 = std::vector<argagg::option_result,_std::allocator<argagg::option_result>_>::back
                      (&this->all);
  uVar2 = option_result::as<unsigned_long>(this_01);
  return uVar2;
}

Assistant:

T option_results::as() const
{
  if (this->all.size() == 0) {
    throw std::out_of_range("no option arguments to convert");
  }
  return this->all.back().as<T>();
}